

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void verifyDbFile(unixFile *pFile)

{
  int iVar1;
  char *pcVar2;
  char *zFormat;
  stat buf;
  stat buf_1;
  undefined1 auStack_128 [16];
  long local_118;
  undefined1 local_98 [8];
  u64 local_90;
  
  if ((pFile->ctrlFlags & 0x80) == 0) {
    iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)pFile->h,auStack_128);
    if (iVar1 == 0) {
      if (local_118 == 1) {
        if (pFile->pInode == (unixInodeInfo *)0x0) {
          return;
        }
        iVar1 = (*aSyscall[4].pCurrent)(pFile->zPath,local_98);
        if ((iVar1 == 0) && (local_90 == (pFile->pInode->fileId).ino)) {
          return;
        }
        pcVar2 = pFile->zPath;
        zFormat = "file renamed while open: %s";
      }
      else if (local_118 == 0) {
        pcVar2 = pFile->zPath;
        zFormat = "file unlinked while open: %s";
      }
      else {
        pcVar2 = pFile->zPath;
        zFormat = "multiple links to file: %s";
      }
    }
    else {
      pcVar2 = pFile->zPath;
      zFormat = "cannot fstat db file %s";
    }
    sqlite3_log(0x1c,zFormat,pcVar2);
  }
  return;
}

Assistant:

static void verifyDbFile(unixFile *pFile){
  struct stat buf;
  int rc;

  /* These verifications occurs for the main database only */
  if( pFile->ctrlFlags & UNIXFILE_NOLOCK ) return;

  rc = osFstat(pFile->h, &buf);
  if( rc!=0 ){
    sqlite3_log(SQLITE_WARNING, "cannot fstat db file %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink==0 ){
    sqlite3_log(SQLITE_WARNING, "file unlinked while open: %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink>1 ){
    sqlite3_log(SQLITE_WARNING, "multiple links to file: %s", pFile->zPath);
    return;
  }
  if( fileHasMoved(pFile) ){
    sqlite3_log(SQLITE_WARNING, "file renamed while open: %s", pFile->zPath);
    return;
  }
}